

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SwitchingFunction.cpp
# Opt level: O0

void __thiscall
OpenMD::SwitchingFunction::setSwitchType(SwitchingFunction *this,SwitchingFunctionType sft)

{
  int in_ESI;
  shared_ptr<OpenMD::CubicSpline> *in_RDI;
  RealType in_stack_00000070;
  RealType in_stack_00000078;
  SwitchingFunction *in_stack_00000080;
  shared_ptr<OpenMD::CubicSpline> *in_stack_ffffffffffffffe0;
  
  if ((in_ESI == 1) || (in_ESI == 0)) {
    if (((ulong)in_RDI[2].super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        & 0x100000000) != 0) {
      std::make_shared<OpenMD::CubicSpline>();
      std::shared_ptr<OpenMD::CubicSpline>::operator=(in_stack_ffffffffffffffe0,in_RDI);
      std::shared_ptr<OpenMD::CubicSpline>::~shared_ptr((shared_ptr<OpenMD::CubicSpline> *)0x2deda4)
      ;
      setSwitch(in_stack_00000080,in_stack_00000078,in_stack_00000070);
    }
  }
  else {
    snprintf(painCave.errMsg,2000,
             "SwitchingFunction::setSwitchType was given unknown function type\n");
    painCave.severity = 1;
    painCave.isFatal = 1;
    simError();
  }
  return;
}

Assistant:

void SwitchingFunction::setSwitchType(SwitchingFunctionType sft) {
    if ((sft == fifth_order_poly) || (sft == cubic)) {
      if (haveSpline_) {
        switchSpline_ = std::make_shared<CubicSpline>();
        setSwitch(rin_, rout_);
      }
    } else {
      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "SwitchingFunction::setSwitchType was given unknown function type\n");
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }
  }